

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_algoim_K.H
# Opt level: O1

bool __thiscall
amrex::algoim::ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_false>
::prune(ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_false> *this)

{
  bool bVar1;
  int iVar2;
  EBPlane *pEVar3;
  int iVar4;
  int iVar5;
  int dim;
  long lVar6;
  double dVar7;
  double dVar8;
  GpuArray<double,_3U> mid;
  
  iVar5 = 0;
  do {
    iVar4 = iVar5;
    iVar2 = this->psiCount;
    if (iVar2 <= iVar4) break;
    mid.arr[0] = 0.0;
    mid.arr[1] = 0.0;
    mid.arr[2] = 0.0;
    pEVar3 = this->phi;
    dVar7 = 0.0;
    lVar6 = 0;
    do {
      if ((this->free).arr[lVar6] == true) {
        dVar7 = dVar7 + ABS((pEVar3->norm).arr[lVar6]);
      }
      else {
        mid.arr[lVar6] =
             *(double *)
              (&DAT_006a3ce0 +
              (ulong)(((this->psi).arr[iVar4].bits >> ((uint)lVar6 & 0x1f) & 1) == 0) * 8);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    pEVar3 = this->phi;
    dVar8 = (mid.arr[2] - (pEVar3->cent).arr[2]) * (pEVar3->norm).arr[2] +
            (mid.arr[0] - (pEVar3->cent).arr[0]) * (pEVar3->norm).arr[0] +
            (mid.arr[1] - (pEVar3->cent).arr[1]) * (pEVar3->norm).arr[1];
    if ((dVar7 * 0.4999999999999989 < dVar8) || (dVar8 < -(dVar7 * 0.4999999999999989))) {
      iVar5 = iVar4;
      if (((0.0 <= dVar8) && (((this->psi).arr[iVar4].bits & 0x18) != 0)) ||
         ((dVar8 <= 0.0 && (((this->psi).arr[iVar4].bits & 0x18) != 0x10)))) {
        this->psiCount = iVar2 + -1;
        bVar1 = (bool)(this->psi).arr[iVar4].bits;
        (this->psi).arr[iVar4].bits = (this->free).arr[(long)iVar2 + 2];
        (this->free).arr[(long)iVar2 + 2] = bVar1;
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
    }
    else {
      bVar1 = true;
      iVar5 = iVar4 + 1;
    }
  } while (bVar1);
  return iVar2 <= iVar4;
}

Assistant:

AMREX_GPU_HOST_DEVICE
    bool prune () noexcept
    {
        static constexpr Real eps = std::numeric_limits<Real>::epsilon();
        static constexpr Real almostone = 1.0-10.*eps;

        for (int i = 0; i < psiCount; )
        {
            GpuArray<Real,N> mid = xrange.midpoint();
            Real dphi_max = 0.0_rt;
            for (int dim = 0; dim < N; ++dim) {
                if (free[dim]) {
                    dphi_max += amrex::Math::abs(phi.grad(dim));
                } else {
                    mid[dim] = xrange(psi[i].side(dim),dim);
                }
            }
            dphi_max *= 0.5*almostone;
            const Real phi_0 = phi(mid);
            bool uniform_sign = (phi_0 > dphi_max) || (phi_0 < -dphi_max);
            if (uniform_sign)
            {
                if ((phi_0 >= 0.0 && psi[i].sign() >= 0) ||
                    (phi_0 <= 0.0 && psi[i].sign() <= 0) )
                {
                    --psiCount;
                    detail::swap(psi[i], psi[psiCount]);
                }
                else {
                    return false;
                }
            }
            else {
                ++i;
            }
        }
        return true;
    }